

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

int __thiscall Centaurus::ParserEM64T<char>::init(ParserEM64T<char> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  *puVar2;
  Identifier *__k;
  reference pvVar3;
  mapped_type *pmVar4;
  socklen_t sVar5;
  ErrorHandler *in_RCX;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  *machine_map_00;
  long in_RDX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  pair<std::__detail::_Node_iterator<std::pair<const_Centaurus::Identifier,_asmjit::Label>,_false,_true>,_bool>
  pVar6;
  CodeHolder *in_stack_fffffffffffff828;
  uint32_t instId;
  CodeEmitter *in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff838;
  uint32_t in_stack_fffffffffffff83c;
  CodeHolder *in_stack_fffffffffffff840;
  Assembler *in_stack_fffffffffffff848;
  value_type *p_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  *__range2_1;
  CompositeATN<char> catn;
  Label finishlabel;
  undefined1 local_6c8 [8];
  Label landfilllabel;
  Label local_6a8;
  reference local_698;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  *__range2;
  Label rejectlabel;
  undefined1 local_658 [8];
  MyConstPool pool;
  undefined1 local_4f0 [8];
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machine_map;
  X86Assembler as;
  ErrorHandler *errhandler_local;
  Logger *logger_local;
  Grammar<char> *grammar_local;
  ParserEM64T<char> *this_local;
  uint32_t signature;
  uint32_t signature_1;
  uint32_t signature_2;
  uint32_t signature_3;
  
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (in_RDX != 0) {
    asmjit::CodeHolder::setLogger
              (in_stack_fffffffffffff840,
               (Logger *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  }
  if (in_RCX != (ErrorHandler *)0x0) {
    asmjit::CodeHolder::setErrorHandler(&this->m_code,in_RCX);
  }
  asmjit::X86Assembler::X86Assembler
            ((X86Assembler *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::unordered_map((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                   *)local_4f0);
  emit_parser_prolog((X86Assembler *)&machine_map._M_h._M_single_bucket);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::Imm::Imm((Imm *)((long)&pool.m_label.super_Operand.super_Operand_.field_0 + 8),0x800000);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  MyConstPool::MyConstPool
            ((MyConstPool *)local_658,(X86Assembler *)&machine_map._M_h._M_single_bucket);
  rejectlabel.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x110000149;
  MyConstPool::load_charclass_filter<char>
            ((MyConstPool *)local_658,
             (X86Xmm *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8),
             (CharClass<char> *)m_skipfilter);
  asmjit::Assembler::newLabel(in_stack_fffffffffffff848);
  puVar2 = Grammar<char>::get_machines((Grammar<char> *)ctx);
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
           ::begin(puVar2);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
      ::end(puVar2);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                         *)&p);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
             ::operator*(&__end0);
    local_698 = pvVar3;
    asmjit::Assembler::newLabel(in_stack_fffffffffffff848);
    pVar6 = std::
            unordered_map<Centaurus::Identifier,asmjit::Label,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>>
            ::emplace<Centaurus::Identifier_const&,asmjit::Label>
                      ((unordered_map<Centaurus::Identifier,asmjit::Label,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>>
                        *)local_4f0,&pvVar3->first,&local_6a8);
    landfilllabel.super_Operand.super_Operand_.field_0._mem.field_2 =
         (anon_union_8_2_78723da6_for_MemData_2)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_asmjit::Label>,_true>.
         _M_cur;
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
    ::operator++(&__end0);
  }
  __k = Grammar<char>::get_root_id((Grammar<char> *)ctx);
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::operator[]((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                *)local_4f0,__k);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff830,(uint32_t)((ulong)in_stack_fffffffffffff828 >> 0x20),
             (Operand_ *)0x16cc91);
  asmjit::Assembler::newLabel(in_stack_fffffffffffff848);
  sVar5 = 0x234088;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::Assembler::bind
            ((Assembler *)&machine_map._M_h._M_single_bucket,(int)local_6c8,__addr,sVar5);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  asmjit::Imm::Imm((Imm *)((long)&finishlabel.super_Operand.super_Operand_.field_0 + 8),8);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  machine_map_00 =
       (unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
        *)(asmjit::x86OpData + 0x4a0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (Operand_ *)in_stack_fffffffffffff830,(Operand_ *)in_stack_fffffffffffff828);
  instId = (uint32_t)((ulong)in_stack_fffffffffffff828 >> 0x20);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff830,instId,(Operand_ *)0x16cfb7);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff830,instId);
  asmjit::Assembler::newLabel(in_stack_fffffffffffff848);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff830,instId,(Operand_ *)0x16d027);
  CompositeATN<char>::CompositeATN((CompositeATN<char> *)&__range2_1,(Grammar<char> *)ctx);
  puVar2 = Grammar<char>::get_machines((Grammar<char> *)ctx);
  __end0_1 = std::
             unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
             ::begin(puVar2);
  p_1 = (value_type *)
        std::
        unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
        ::end(puVar2);
  while( true ) {
    sVar5 = (socklen_t)machine_map_00;
    bVar1 = std::__detail::operator!=
                      (&__end0_1.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                         *)&p_1);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
             ::operator*(&__end0_1);
    pmVar4 = std::
             unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
             ::operator[]((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                           *)local_4f0,&pvVar3->first);
    asmjit::Assembler::bind
              ((Assembler *)&machine_map._M_h._M_single_bucket,(int)pmVar4,__addr_01,sVar5);
    machine_map_00 =
         (unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
          *)local_4f0;
    emit_machine(this,(X86Assembler *)&machine_map._M_h._M_single_bucket,&pvVar3->second,
                 machine_map_00,(CompositeATN<char> *)&__range2_1,&pvVar3->first,(Label *)&__range2,
                 (MyConstPool *)local_658);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
    ::operator++(&__end0_1);
  }
  asmjit::Assembler::bind
            ((Assembler *)&machine_map._M_h._M_single_bucket,(int)&catn + 0x40,__addr_00,sVar5);
  emit_parser_epilog((X86Assembler *)&machine_map._M_h._M_single_bucket,(Label *)&__range2);
  MyConstPool::embed((MyConstPool *)local_658);
  asmjit::CodeEmitter::finalize((CodeEmitter *)&machine_map._M_h._M_single_bucket);
  (*(this->m_runtime).super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (&this->m_runtime,&this->m_func,&this->m_code);
  CompositeATN<char>::~CompositeATN((CompositeATN<char> *)&__range2_1);
  MyConstPool::~MyConstPool((MyConstPool *)local_658);
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::~unordered_map((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                    *)local_4f0);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x16d234);
  return extraout_EAX;
}

Assistant:

void ParserEM64T<TCHAR>::init(const Grammar<TCHAR>& grammar, asmjit::Logger *logger, asmjit::ErrorHandler *errhandler)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);
    if (errhandler != NULL)
        m_code.setErrorHandler(errhandler);

    asmjit::X86Assembler as(&m_code);

    std::unordered_map<Identifier, asmjit::Label> machine_map;

    emit_parser_prolog(as);

    as.mov(CONTEXT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));
    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG2_STACK_OFFSET));
    as.mov(OUTPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG3_STACK_OFFSET));
    as.mov(OUTPUT_BOUND_REG, OUTPUT_REG);
    as.add(OUTPUT_BOUND_REG, asmjit::Imm(AST_BUF_SIZE));
    as.mov(INPUT_BASE_REG, INPUT_REG);

    MyConstPool pool(as);

    pool.load_charclass_filter(PATTERN_REG, m_skipfilter);

    asmjit::Label rejectlabel = as.newLabel();

    {
        for (const auto& p : grammar.get_machines())
        {
            machine_map.emplace(p.first, as.newLabel());
        }

        as.call(machine_map[grammar.get_root_id()]);
    }

    asmjit::Label landfilllabel = as.newLabel();
    as.xor_(MARKER_REG, MARKER_REG);
    as.bind(landfilllabel);
    as.movnti(asmjit::X86Mem(OUTPUT_REG, 0), MARKER_REG);
    as.add(OUTPUT_REG, asmjit::Imm(8));
    as.cmp(OUTPUT_REG, OUTPUT_BOUND_REG);
    as.jne(landfilllabel);
    as.sfence();

    asmjit::Label finishlabel = as.newLabel();
    as.jmp(finishlabel);

    CompositeATN<TCHAR> catn(grammar);

    for (const auto& p : grammar.get_machines())
    {
        as.bind(machine_map[p.first]);

        emit_machine(as, p.second, machine_map, catn, p.first, rejectlabel, pool);
    }

    as.bind(finishlabel);

    emit_parser_epilog(as, rejectlabel);

    pool.embed();

    as.finalize();

    m_runtime.add(&m_func, &m_code);
}